

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void __thiscall CSnapIDPool::Reset(CSnapIDPool *this)

{
  long lVar1;
  
  lVar1 = 0;
  while (lVar1 != 0x4000) {
    this->m_aIDs[lVar1].m_Next = (short)(lVar1 + 1);
    this->m_aIDs[lVar1].m_State = 0;
    lVar1 = lVar1 + 1;
  }
  this->m_aIDs[0x3fff].m_Next = -1;
  this->m_FirstFree = 0;
  this->m_FirstTimed = -1;
  this->m_LastTimed = -1;
  this->m_Usage = 0;
  this->m_InUsage = 0;
  return;
}

Assistant:

void CSnapIDPool::Reset()
{
	for(int i = 0; i < MAX_IDS; i++)
	{
		m_aIDs[i].m_Next = i+1;
		m_aIDs[i].m_State = 0;
	}

	m_aIDs[MAX_IDS-1].m_Next = -1;
	m_FirstFree = 0;
	m_FirstTimed = -1;
	m_LastTimed = -1;
	m_Usage = 0;
	m_InUsage = 0;
}